

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

size_t RVO::linearProgram3(vector<RVO::Plane,_std::allocator<RVO::Plane>_> *planes,float radius,
                          Vector3 *optVelocity,bool directionOpt,Vector3 *result)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  pointer pPVar6;
  undefined7 in_register_00000011;
  pointer pPVar7;
  size_t planeNo;
  long lVar8;
  float fVar9;
  float fVar10;
  
  fVar1 = optVelocity->val_[0];
  fVar10 = optVelocity->val_[2];
  if ((int)CONCAT71(in_register_00000011,directionOpt) == 0) {
    fVar2 = optVelocity->val_[1];
    fVar9 = fVar10 * fVar10 + fVar1 * fVar1 + fVar2 * fVar2;
    if (fVar9 <= radius * radius) {
      result->val_[2] = optVelocity->val_[2];
      *(undefined8 *)result->val_ = *(undefined8 *)optVelocity->val_;
      goto LAB_00105f16;
    }
    fVar9 = 1.0 / SQRT(fVar9);
    fVar10 = fVar10 * fVar9;
    *(ulong *)result->val_ = CONCAT44(radius * fVar9 * fVar2,radius * fVar9 * fVar1);
  }
  else {
    *(ulong *)result->val_ = CONCAT44(radius * optVelocity->val_[1],radius * fVar1);
  }
  result->val_[2] = fVar10 * radius;
LAB_00105f16:
  pPVar6 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar7 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar7 == pPVar6) {
    sVar5 = 0;
  }
  else {
    lVar8 = 0x14;
    planeNo = 0;
    do {
      uVar3 = *(undefined8 *)result->val_;
      fVar1 = result->val_[2];
      if (0.0 < (*(float *)((long)(&pPVar6->point + -1) + lVar8) - fVar1) *
                *(float *)((long)(pPVar6->point).val_ + lVar8) +
                (*(float *)((long)(pPVar6->point).val_ + lVar8 + -0x14) - (float)uVar3) *
                *(float *)((long)(pPVar6->point).val_ + lVar8 + -8) +
                (*(float *)((long)(pPVar6->point).val_ + lVar8 + -0x10) -
                (float)((ulong)uVar3 >> 0x20)) * *(float *)((long)(pPVar6->point).val_ + lVar8 + -4)
         ) {
        bVar4 = linearProgram2(planes,planeNo,radius,optVelocity,directionOpt,result);
        if (!bVar4) {
          *(undefined8 *)result->val_ = uVar3;
          result->val_[2] = fVar1;
          return planeNo;
        }
        pPVar6 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar7 = (planes->super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      planeNo = planeNo + 1;
      sVar5 = ((long)pPVar7 - (long)pPVar6 >> 3) * -0x5555555555555555;
      lVar8 = lVar8 + 0x18;
    } while (planeNo < sVar5);
  }
  return sVar5;
}

Assistant:

size_t linearProgram3(const std::vector<Plane> &planes, float radius, const Vector3 &optVelocity, bool directionOpt, Vector3 &result)
	{
		if (directionOpt) {
			/* Optimize direction. Note that the optimization velocity is of unit length in this case. */
			result = optVelocity * radius;
		}
		else if (absSq(optVelocity) > sqr(radius)) {
			/* Optimize closest point and outside circle. */
			result = normalize(optVelocity) * radius;
		}
		else {
			/* Optimize closest point and inside circle. */
			result = optVelocity;
		}

		for (size_t i = 0; i < planes.size(); ++i) {
			if (planes[i].normal * (planes[i].point - result) > 0.0f) {
				/* Result does not satisfy constraint i. Compute new optimal result. */
				const Vector3 tempResult = result;

				if (!linearProgram2(planes, i, radius, optVelocity, directionOpt, result)) {
					result = tempResult;
					return i;
				}
			}
		}

		return planes.size();
	}